

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-softmaxes.cc
# Opt level: O2

void __thiscall
dynet::SparsemaxLoss::forward_dev_impl<dynet::Device_CPU>
          (SparsemaxLoss *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  float fVar1;
  Tensor *pTVar2;
  pointer puVar3;
  pointer puVar4;
  void *pvVar5;
  StoragePointerType pfVar6;
  float *pfVar7;
  ulong uVar8;
  runtime_error *prVar9;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  StoragePointerType local_1c8;
  long local_1c0;
  ostringstream oss;
  long local_1a0;
  
  pTVar2 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((1 < (pTVar2->d).nd) && ((pTVar2->d).d[1] != 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"SparsemaxLoss not yet implemented for multiple columns");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&local_1c8);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar11 = (pTVar2->d).d[0];
  if (0x10000 < (long)(int)uVar11) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,
                    "MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&local_1c8);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar3 = (this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar5 = (this->super_Node).aux_mem;
  std::__partial_sort_copy<float*,float*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<float>>>
            (pTVar2->v,pTVar2->v + (int)uVar11,pvVar5);
  uVar10 = 0;
  uVar8 = 0;
  if (0 < (int)uVar11) {
    uVar8 = (ulong)uVar11;
  }
  fVar12 = 0.0;
  do {
    if (uVar8 == uVar10) break;
    fVar1 = *(float *)((long)pvVar5 + uVar10 * 4);
    fVar12 = fVar12 + fVar1;
    uVar10 = uVar10 + 1;
  } while (fVar12 < (float)(int)uVar10 * fVar1 + 1.0);
  pTVar2 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pfVar6 = (StoragePointerType)(this->super_Node).aux_mem;
  if ((pTVar2->d).nd == 0) {
    uVar11 = 1;
  }
  else {
    uVar11 = (pTVar2->d).d[0];
  }
  _oss = Tensor::t<1>(pTVar2);
  local_1c8 = pfVar6;
  local_1c0 = (long)(int)uVar11;
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
  operator=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1> *)
            &local_1c8,
            (TensorCwiseBinaryOp<Eigen::internal::scalar_max_op<float,_float,_0>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
             *)&oss);
  Tensor::t<1>(*(xs->
                super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
  local_1c8 = fx->v;
  _oss = pfVar6;
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,1>::
  operator=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,1> *)
            &local_1c8,
            (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>
             *)&oss);
  local_1c8 = fx->v;
  local_1a0 = (long)(int)uVar11;
  _oss = local_1c8;
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,1>::
  operator=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,1> *)
            &local_1c8,
            (TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>_>
             *)&oss);
  for (uVar8 = 0; ((ulong)((long)puVar3 - (long)puVar4) >> 2 & 0xffffffff) != uVar8;
      uVar8 = uVar8 + 1) {
    pfVar7 = fx->v;
    Tensor::t<1>(*(xs->
                  super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start);
    _oss = pfVar7;
    local_1c8 = fx->v;
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,1>::
    operator=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,1> *)
              &local_1c8,
              (TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorChippingOp<0L,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
               *)&oss);
  }
  local_1c8 = fx->v;
  _oss = local_1c8;
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,1>::
  operator=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,1> *)
            &local_1c8,
            (TensorCwiseBinaryOp<Eigen::internal::scalar_max_op<float,_float,_0>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>_>
             *)&oss);
  return;
}

Assistant:

void SparsemaxLoss::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
#ifdef __CUDACC__
    DYNET_NO_CUDA_IMPL_ERROR("SparsemaxLoss forward");
#else
    const int rows = xs[0]->d.rows();
    if (rows > MAX_SPARSEMAX_LOSS_ROWS)
      DYNET_RUNTIME_ERR("MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.");
    const unsigned qsupport_size = pq->size();
    const float qprop = 1.f / qsupport_size;

    float *zs = static_cast<float*>(aux_mem);
    std::partial_sort_copy(xs[0]->v, xs[0]->v+rows, zs, zs + rows, std::greater<float>());
    float sum = 0, maxsum = 0;
    int k = 0;
    for (k = 0; k < rows; ++k) {
      sum += zs[k];
      float t = 1 + (k + 1) * zs[k];
      if (t <= sum) break;
      maxsum = sum;
    }
    float tau = (maxsum - 1) / k;
    Tensor tsm(xs[0]->d, (float*)aux_mem, xs[0]->device, DeviceMempool::FXS);
    tsm.t<1>() = (xs[0]->t<1>() - tau).cwiseMax(0.f);
    fx.t<0>() = ( (tsm.t<1>() != 0.f).cast<float>() * (xs[0]->t<1>().square() - (tau * tau)) ).sum();
    fx.t<0>() = ( fx.t<0>() + qprop * qprop * qsupport_size ) / 2.f;
    for (unsigned i = 0; i < qsupport_size; ++i)
      fx.t<0>() = fx.t<0>() - xs[0]->t<1>().chip<0>((*pq)[i]) * qprop;
    fx.t<0>() = fx.t<0>().cwiseMax(0.f);
#endif
  } else {
    DYNET_RUNTIME_ERR("SparsemaxLoss not yet implemented for multiple columns");
  }
}